

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1651::run(TestCase1651 *this)

{
  long *plVar1;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Reader value;
  Reader value_00;
  Reader value_01;
  Reader value_02;
  Reader value_03;
  Reader value_04;
  ArrayPtr<const_capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader>
  lists_00;
  Fault f;
  undefined4 uStack_29c;
  uint local_298;
  StructPointerCount local_294;
  int local_290;
  Orphanage local_288;
  ArrayPtr<const_char> local_278;
  undefined8 local_268;
  int local_260;
  ReaderFor<capnp::List<capnproto_test::capnp::test::TestNewVersion>_> cat;
  Reader lists [2];
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestNewVersion>_> list2;
  Orphanage orphanage;
  Orphan<capnproto_test::capnp::test::TestAnyPointer> orphan3;
  Orphan<capnproto_test::capnp::test::TestAnyPointer> orphan2;
  Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> orphan1;
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> list1;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  orphanage = MessageBuilder::getOrphanage(&message.super_MessageBuilder);
  Orphanage::newOrphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,(capnp::Kind)3>>
            (&orphan1,&orphanage,2);
  OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>,_(capnp::Kind)6>
  ::apply(&list1,&orphan1.builder);
  ListBuilder::getStructElement((StructBuilder *)lists,&list1.builder,0);
  lists[0].reader.ptr[0] = '\f';
  lists[0].reader.ptr[1] = '\0';
  lists[0].reader.ptr[2] = '\0';
  lists[0].reader.ptr[3] = '\0';
  lists[0].reader.ptr[4] = '\0';
  lists[0].reader.ptr[5] = '\0';
  lists[0].reader.ptr[6] = '\0';
  lists[0].reader.ptr[7] = '\0';
  ListBuilder::getStructElement((StructBuilder *)lists,&list1.builder,0);
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2((Builder *)lists,value);
  ListBuilder::getStructElement((StructBuilder *)lists,&list1.builder,1);
  lists[0].reader.ptr[0] = '\"';
  lists[0].reader.ptr[1] = '\0';
  lists[0].reader.ptr[2] = '\0';
  lists[0].reader.ptr[3] = '\0';
  lists[0].reader.ptr[4] = '\0';
  lists[0].reader.ptr[5] = '\0';
  lists[0].reader.ptr[6] = '\0';
  lists[0].reader.ptr[7] = '\0';
  ListBuilder::getStructElement((StructBuilder *)lists,&list1.builder,1);
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "bar";
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2((Builder *)lists,value_00);
  Orphanage::newOrphan<capnproto_test::capnp::test::TestAnyPointer>(&orphan2,&orphanage);
  OrphanGetImpl<capnproto_test::capnp::test::TestAnyPointer,_(capnp::Kind)3>::apply
            ((Builder *)lists,&orphan2.builder);
  cat.reader.segment = lists[0].reader.segment;
  cat.reader.capTable = lists[0].reader.capTable;
  cat.reader.ptr = (byte *)lists[0].reader._24_8_;
  AnyPointer::Builder::
  initAs<capnp::List<capnproto_test::capnp::test::TestNewVersion,(capnp::Kind)3>>
            (&list2,(Builder *)&cat,2);
  ListBuilder::getStructElement((StructBuilder *)lists,&list2.builder,0);
  lists[0].reader.ptr[0] = '8';
  lists[0].reader.ptr[1] = '\0';
  lists[0].reader.ptr[2] = '\0';
  lists[0].reader.ptr[3] = '\0';
  lists[0].reader.ptr[4] = '\0';
  lists[0].reader.ptr[5] = '\0';
  lists[0].reader.ptr[6] = '\0';
  lists[0].reader.ptr[7] = '\0';
  ListBuilder::getStructElement((StructBuilder *)lists,&list2.builder,0);
  value_01.super_StringPtr.content.size_ = 4;
  value_01.super_StringPtr.content.ptr = "baz";
  capnproto_test::capnp::test::TestNewVersion::Builder::setOld2((Builder *)lists,value_01);
  ListBuilder::getStructElement((StructBuilder *)lists,&list2.builder,0);
  lists[0].reader.ptr[8] = 0xa0;
  lists[0].reader.ptr[9] = '\x03';
  lists[0].reader.ptr[10] = '\0';
  lists[0].reader.ptr[0xb] = '\0';
  lists[0].reader.ptr[0xc] = '\0';
  lists[0].reader.ptr[0xd] = '\0';
  lists[0].reader.ptr[0xe] = '\0';
  lists[0].reader.ptr[0xf] = '\0';
  ListBuilder::getStructElement((StructBuilder *)lists,&list2.builder,0);
  value_02.super_StringPtr.content.size_ = 6;
  value_02.super_StringPtr.content.ptr = "corge";
  capnproto_test::capnp::test::TestNewVersion::Builder::setNew2((Builder *)lists,value_02);
  ListBuilder::getStructElement((StructBuilder *)lists,&list2.builder,1);
  lists[0].reader.ptr[0] = 'N';
  lists[0].reader.ptr[1] = '\0';
  lists[0].reader.ptr[2] = '\0';
  lists[0].reader.ptr[3] = '\0';
  lists[0].reader.ptr[4] = '\0';
  lists[0].reader.ptr[5] = '\0';
  lists[0].reader.ptr[6] = '\0';
  lists[0].reader.ptr[7] = '\0';
  ListBuilder::getStructElement((StructBuilder *)lists,&list2.builder,1);
  value_03.super_StringPtr.content.size_ = 4;
  value_03.super_StringPtr.content.ptr = "qux";
  capnproto_test::capnp::test::TestNewVersion::Builder::setOld2((Builder *)lists,value_03);
  ListBuilder::getStructElement((StructBuilder *)lists,&list2.builder,1);
  lists[0].reader.ptr[8] = '\x13';
  lists[0].reader.ptr[9] = '\x02';
  lists[0].reader.ptr[10] = '\0';
  lists[0].reader.ptr[0xb] = '\0';
  lists[0].reader.ptr[0xc] = '\0';
  lists[0].reader.ptr[0xd] = '\0';
  lists[0].reader.ptr[0xe] = '\0';
  lists[0].reader.ptr[0xf] = '\0';
  ListBuilder::getStructElement((StructBuilder *)lists,&list2.builder,1);
  value_04.super_StringPtr.content.size_ = 7;
  value_04.super_StringPtr.content.ptr = "grault";
  capnproto_test::capnp::test::TestNewVersion::Builder::setNew2((Builder *)lists,value_04);
  OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>,_(capnp::Kind)6>
  ::applyReader(lists,&orphan1.builder);
  OrphanGetImpl<capnproto_test::capnp::test::TestAnyPointer,_(capnp::Kind)3>::applyReader
            ((Reader *)&cat,&orphan2.builder);
  bVar4 = cat.reader.structPointerCount != 0;
  plVar1 = (long *)0x0;
  if (bVar4) {
    plVar1 = (long *)CONCAT44(cat.reader.step,cat.reader.elementCount);
  }
  iVar3 = 0x7fffffff;
  if (bVar4) {
    iVar3 = cat.reader.nestingLimit;
  }
  f.exception._0_4_ = 0;
  f.exception._4_4_ = 0;
  uVar5 = 0;
  uVar6 = 0;
  if (bVar4) {
    f.exception._0_4_ = cat.reader.segment._0_4_;
    f.exception._4_4_ = cat.reader.segment._4_4_;
    uVar5 = cat.reader.capTable._0_4_;
    uVar6 = cat.reader.capTable._4_4_;
  }
  AnyPointer::Reader::getAs<capnp::List<capnproto_test::capnp::test::TestOldVersion,(capnp::Kind)3>>
            (lists + 1,(Reader *)&f);
  Orphanage::newOrphan<capnproto_test::capnp::test::TestAnyPointer>(&orphan3,&orphanage);
  OrphanGetImpl<capnproto_test::capnp::test::TestAnyPointer,_(capnp::Kind)3>::apply
            ((Builder *)&cat,&orphan3.builder);
  local_278.size_ = (size_t)cat.reader.capTable;
  local_278.ptr = (char *)cat.reader.segment;
  local_288 = MessageBuilder::getOrphanage(&message.super_MessageBuilder);
  lists_00.size_ = 2;
  lists_00.ptr = lists;
  Orphanage::
  newOrphanConcat<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader>
            ((Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> *)&f
             ,&local_288,lists_00);
  AnyPointer::Builder::
  adopt<capnp::List<capnproto_test::capnp::test::TestOldVersion,(capnp::Kind)3>>
            ((Builder *)&local_278,
             (Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> *)&f
            );
  OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&f);
  OrphanGetImpl<capnproto_test::capnp::test::TestAnyPointer,_(capnp::Kind)3>::applyReader
            ((Reader *)&f,&orphan3.builder);
  bVar4 = local_294 != 0;
  local_268 = 0;
  if (bVar4) {
    local_268 = CONCAT44(uStack_29c,iVar3);
  }
  local_260 = 0x7fffffff;
  if (bVar4) {
    local_260 = local_290;
  }
  local_278.ptr._0_4_ = 0;
  local_278.ptr._4_4_ = 0;
  local_278.size_._0_4_ = 0;
  local_278.size_._4_4_ = 0;
  if (bVar4) {
    local_278.ptr._0_4_ = f.exception._0_4_;
    local_278.ptr._4_4_ = f.exception._4_4_;
    local_278.size_._0_4_ = uVar5;
    local_278.size_._4_4_ = uVar6;
  }
  AnyPointer::Reader::getAs<capnp::List<capnproto_test::capnp::test::TestNewVersion,(capnp::Kind)3>>
            (&cat,(Reader *)&local_278);
  if (cat.reader.elementCount == 4) {
    ListReader::getStructElement((StructReader *)&f,&cat.reader,0);
    if (((local_298 < 0x40) || (*plVar1 != 0xc)) && (kj::_::Debug::minSeverity < 3)) {
      local_288.arena._0_4_ = 0xc;
      ListReader::getStructElement((StructReader *)&f,&cat.reader,0);
      if (local_298 < 0x40) {
        pcVar2 = (char *)0x0;
      }
      else {
        pcVar2 = (char *)*plVar1;
      }
      local_278.ptr = pcVar2;
      kj::_::Debug::log<char_const(&)[44],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x699,ERROR,
                 "\"failed: expected \" \"(12) == (cat[0].getOld1())\", 12, cat[0].getOld1()",
                 (char (*) [44])"failed: expected (12) == (cat[0].getOld1())",(int *)&local_288,
                 (long *)&local_278);
    }
    ListReader::getStructElement((StructReader *)&f,&cat.reader,0);
    local_278 = (ArrayPtr<const_char>)
                capnproto_test::capnp::test::TestNewVersion::Reader::getOld2((Reader *)&f);
    bVar4 = kj::operator==("foo",(StringPtr *)&local_278);
    if (!bVar4 && kj::_::Debug::minSeverity < 3) {
      ListReader::getStructElement((StructReader *)&f,&cat.reader,0);
      local_278 = (ArrayPtr<const_char>)
                  capnproto_test::capnp::test::TestNewVersion::Reader::getOld2((Reader *)&f);
      kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x69a,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (cat[0].getOld2())\", \"foo\", cat[0].getOld2()"
                 ,(char (*) [47])"failed: expected (\"foo\") == (cat[0].getOld2())",
                 (char (*) [4])"foo",(Reader *)&local_278);
    }
    ListReader::getStructElement((StructReader *)&f,&cat.reader,0);
    if (((0x7f < local_298) && (plVar1[1] != 0)) && (kj::_::Debug::minSeverity < 3)) {
      local_288.arena._0_4_ = 0x3db;
      ListReader::getStructElement((StructReader *)&f,&cat.reader,0);
      pcVar2 = (char *)0x3db;
      if (0x7f < local_298) {
        pcVar2 = (char *)(plVar1[1] ^ 0x3db);
      }
      local_278.ptr = pcVar2;
      kj::_::Debug::log<char_const(&)[45],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x69b,ERROR,
                 "\"failed: expected \" \"(987) == (cat[0].getNew1())\", 987, cat[0].getNew1()",
                 (char (*) [45])"failed: expected (987) == (cat[0].getNew1())",(int *)&local_288,
                 (long *)&local_278);
    }
    ListReader::getStructElement((StructReader *)&f,&cat.reader,0);
    bVar4 = capnproto_test::capnp::test::TestNewVersion::Reader::hasNew2((Reader *)&f);
    if (bVar4 && kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x69c,ERROR,"\"failed: expected \" \"!(cat[0].hasNew2())\"",
                 (char (*) [37])"failed: expected !(cat[0].hasNew2())");
    }
    ListReader::getStructElement((StructReader *)&f,&cat.reader,1);
    if (((local_298 < 0x40) || (*plVar1 != 0x22)) && (kj::_::Debug::minSeverity < 3)) {
      local_288.arena._0_4_ = 0x22;
      ListReader::getStructElement((StructReader *)&f,&cat.reader,1);
      if (local_298 < 0x40) {
        pcVar2 = (char *)0x0;
      }
      else {
        pcVar2 = (char *)*plVar1;
      }
      local_278.ptr = pcVar2;
      kj::_::Debug::log<char_const(&)[44],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x69e,ERROR,
                 "\"failed: expected \" \"(34) == (cat[1].getOld1())\", 34, cat[1].getOld1()",
                 (char (*) [44])"failed: expected (34) == (cat[1].getOld1())",(int *)&local_288,
                 (long *)&local_278);
    }
    ListReader::getStructElement((StructReader *)&f,&cat.reader,1);
    local_278 = (ArrayPtr<const_char>)
                capnproto_test::capnp::test::TestNewVersion::Reader::getOld2((Reader *)&f);
    bVar4 = kj::operator==("bar",(StringPtr *)&local_278);
    if (!bVar4 && kj::_::Debug::minSeverity < 3) {
      ListReader::getStructElement((StructReader *)&f,&cat.reader,1);
      local_278 = (ArrayPtr<const_char>)
                  capnproto_test::capnp::test::TestNewVersion::Reader::getOld2((Reader *)&f);
      kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x69f,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (cat[1].getOld2())\", \"bar\", cat[1].getOld2()"
                 ,(char (*) [47])"failed: expected (\"bar\") == (cat[1].getOld2())",
                 (char (*) [4])0x2c587e,(Reader *)&local_278);
    }
    ListReader::getStructElement((StructReader *)&f,&cat.reader,1);
    if (((0x7f < local_298) && (plVar1[1] != 0)) && (kj::_::Debug::minSeverity < 3)) {
      local_288.arena._0_4_ = 0x3db;
      ListReader::getStructElement((StructReader *)&f,&cat.reader,1);
      pcVar2 = (char *)0x3db;
      if (0x7f < local_298) {
        pcVar2 = (char *)(plVar1[1] ^ 0x3db);
      }
      local_278.ptr = pcVar2;
      kj::_::Debug::log<char_const(&)[45],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a0,ERROR,
                 "\"failed: expected \" \"(987) == (cat[1].getNew1())\", 987, cat[1].getNew1()",
                 (char (*) [45])"failed: expected (987) == (cat[1].getNew1())",(int *)&local_288,
                 (long *)&local_278);
    }
    ListReader::getStructElement((StructReader *)&f,&cat.reader,1);
    bVar4 = capnproto_test::capnp::test::TestNewVersion::Reader::hasNew2((Reader *)&f);
    if (bVar4 && kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a1,ERROR,"\"failed: expected \" \"!(cat[1].hasNew2())\"",
                 (char (*) [37])"failed: expected !(cat[1].hasNew2())");
    }
    ListReader::getStructElement((StructReader *)&f,&cat.reader,2);
    if (((local_298 < 0x40) || (*plVar1 != 0x38)) && (kj::_::Debug::minSeverity < 3)) {
      local_288.arena._0_4_ = 0x38;
      ListReader::getStructElement((StructReader *)&f,&cat.reader,2);
      if (local_298 < 0x40) {
        pcVar2 = (char *)0x0;
      }
      else {
        pcVar2 = (char *)*plVar1;
      }
      local_278.ptr = pcVar2;
      kj::_::Debug::log<char_const(&)[44],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a3,ERROR,
                 "\"failed: expected \" \"(56) == (cat[2].getOld1())\", 56, cat[2].getOld1()",
                 (char (*) [44])"failed: expected (56) == (cat[2].getOld1())",(int *)&local_288,
                 (long *)&local_278);
    }
    ListReader::getStructElement((StructReader *)&f,&cat.reader,2);
    local_278 = (ArrayPtr<const_char>)
                capnproto_test::capnp::test::TestNewVersion::Reader::getOld2((Reader *)&f);
    bVar4 = kj::operator==("baz",(StringPtr *)&local_278);
    if (!bVar4 && kj::_::Debug::minSeverity < 3) {
      ListReader::getStructElement((StructReader *)&f,&cat.reader,2);
      local_278 = (ArrayPtr<const_char>)
                  capnproto_test::capnp::test::TestNewVersion::Reader::getOld2((Reader *)&f);
      kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a4,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (cat[2].getOld2())\", \"baz\", cat[2].getOld2()"
                 ,(char (*) [47])"failed: expected (\"baz\") == (cat[2].getOld2())",
                 (char (*) [4])0x2cc7a6,(Reader *)&local_278);
    }
    ListReader::getStructElement((StructReader *)&f,&cat.reader,2);
    if (((local_298 < 0x80) || (plVar1[1] != 0x3a0)) && (kj::_::Debug::minSeverity < 3)) {
      local_288.arena._0_4_ = 0x7b;
      ListReader::getStructElement((StructReader *)&f,&cat.reader,2);
      pcVar2 = (char *)0x3db;
      if (0x7f < local_298) {
        pcVar2 = (char *)(plVar1[1] ^ 0x3db);
      }
      local_278.ptr = pcVar2;
      kj::_::Debug::log<char_const(&)[45],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a5,ERROR,
                 "\"failed: expected \" \"(123) == (cat[2].getNew1())\", 123, cat[2].getNew1()",
                 (char (*) [45])"failed: expected (123) == (cat[2].getNew1())",(int *)&local_288,
                 (long *)&local_278);
    }
    ListReader::getStructElement((StructReader *)&f,&cat.reader,2);
    local_278 = (ArrayPtr<const_char>)
                capnproto_test::capnp::test::TestNewVersion::Reader::getNew2((Reader *)&f);
    bVar4 = kj::operator==("corge",(StringPtr *)&local_278);
    if (!bVar4 && kj::_::Debug::minSeverity < 3) {
      ListReader::getStructElement((StructReader *)&f,&cat.reader,2);
      local_278 = (ArrayPtr<const_char>)
                  capnproto_test::capnp::test::TestNewVersion::Reader::getNew2((Reader *)&f);
      kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a6,ERROR,
                 "\"failed: expected \" \"(\\\"corge\\\") == (cat[2].getNew2())\", \"corge\", cat[2].getNew2()"
                 ,(char (*) [49])"failed: expected (\"corge\") == (cat[2].getNew2())",
                 (char (*) [6])"corge",(Reader *)&local_278);
    }
    ListReader::getStructElement((StructReader *)&f,&cat.reader,3);
    if (((local_298 < 0x40) || (*plVar1 != 0x4e)) && (kj::_::Debug::minSeverity < 3)) {
      local_288.arena._0_4_ = 0x4e;
      ListReader::getStructElement((StructReader *)&f,&cat.reader,3);
      if (local_298 < 0x40) {
        pcVar2 = (char *)0x0;
      }
      else {
        pcVar2 = (char *)*plVar1;
      }
      local_278.ptr = pcVar2;
      kj::_::Debug::log<char_const(&)[44],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a8,ERROR,
                 "\"failed: expected \" \"(78) == (cat[3].getOld1())\", 78, cat[3].getOld1()",
                 (char (*) [44])"failed: expected (78) == (cat[3].getOld1())",(int *)&local_288,
                 (long *)&local_278);
    }
    ListReader::getStructElement((StructReader *)&f,&cat.reader,3);
    local_278 = (ArrayPtr<const_char>)
                capnproto_test::capnp::test::TestNewVersion::Reader::getOld2((Reader *)&f);
    bVar4 = kj::operator==("qux",(StringPtr *)&local_278);
    if (!bVar4 && kj::_::Debug::minSeverity < 3) {
      ListReader::getStructElement((StructReader *)&f,&cat.reader,3);
      local_278 = (ArrayPtr<const_char>)
                  capnproto_test::capnp::test::TestNewVersion::Reader::getOld2((Reader *)&f);
      kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a9,ERROR,
                 "\"failed: expected \" \"(\\\"qux\\\") == (cat[3].getOld2())\", \"qux\", cat[3].getOld2()"
                 ,(char (*) [47])"failed: expected (\"qux\") == (cat[3].getOld2())",
                 (char (*) [4])0x2d2176,(Reader *)&local_278);
    }
    ListReader::getStructElement((StructReader *)&f,&cat.reader,3);
    if (((local_298 < 0x80) || (plVar1[1] != 0x213)) && (kj::_::Debug::minSeverity < 3)) {
      local_288.arena._0_4_ = 0x1c8;
      ListReader::getStructElement((StructReader *)&f,&cat.reader,3);
      pcVar2 = (char *)0x3db;
      if (0x7f < local_298) {
        pcVar2 = (char *)(plVar1[1] ^ 0x3db);
      }
      local_278.ptr = pcVar2;
      kj::_::Debug::log<char_const(&)[45],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6aa,ERROR,
                 "\"failed: expected \" \"(456) == (cat[3].getNew1())\", 456, cat[3].getNew1()",
                 (char (*) [45])"failed: expected (456) == (cat[3].getNew1())",(int *)&local_288,
                 (long *)&local_278);
    }
    ListReader::getStructElement((StructReader *)&f,&cat.reader,3);
    local_278 = (ArrayPtr<const_char>)
                capnproto_test::capnp::test::TestNewVersion::Reader::getNew2((Reader *)&f);
    bVar4 = kj::operator==("grault",(StringPtr *)&local_278);
    if (!bVar4 && kj::_::Debug::minSeverity < 3) {
      ListReader::getStructElement((StructReader *)&f,&cat.reader,3);
      local_278 = (ArrayPtr<const_char>)
                  capnproto_test::capnp::test::TestNewVersion::Reader::getNew2((Reader *)&f);
      kj::_::Debug::log<char_const(&)[50],char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6ab,ERROR,
                 "\"failed: expected \" \"(\\\"grault\\\") == (cat[3].getNew2())\", \"grault\", cat[3].getNew2()"
                 ,(char (*) [50])"failed: expected (\"grault\") == (cat[3].getNew2())",
                 (char (*) [7])"grault",(Reader *)&local_278);
    }
    OrphanBuilder::~OrphanBuilder(&orphan3.builder);
    OrphanBuilder::~OrphanBuilder(&orphan2.builder);
    OrphanBuilder::~OrphanBuilder(&orphan1.builder);
    MallocMessageBuilder::~MallocMessageBuilder(&message);
    return;
  }
  local_278.ptr._0_4_ = 4;
  local_288.arena._0_4_ = cat.reader.elementCount;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
             ,0x697,FAILED,"(4) == (cat.size())","4, cat.size()",(int *)&local_278,
             (uint *)&local_288);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(Orphans, ConcatenateStructLists) {
  // In this test, we not only concatenate two struct lists, but we concatenate in a list that
  // contains a newer-than-expected version of the struct with extra fields, in order to verify
  // that the new fields aren't lost.

  MallocMessageBuilder message;
  auto orphanage = message.getOrphanage();

  auto orphan1 = orphanage.newOrphan<List<test::TestOldVersion>>(2);
  auto list1 = orphan1.get();
  list1[0].setOld1(12);
  list1[0].setOld2("foo");
  list1[1].setOld1(34);
  list1[1].setOld2("bar");

  auto orphan2 = orphanage.newOrphan<test::TestAnyPointer>();
  auto list2 = orphan2.get().getAnyPointerField().initAs<List<test::TestNewVersion>>(2);
  list2[0].setOld1(56);
  list2[0].setOld2("baz");
  list2[0].setNew1(123);
  list2[0].setNew2("corge");
  list2[1].setOld1(78);
  list2[1].setOld2("qux");
  list2[1].setNew1(456);
  list2[1].setNew2("grault");

  List<test::TestOldVersion>::Reader lists[] = {
    orphan1.getReader(),
    orphan2.getReader().getAnyPointerField().getAs<List<test::TestOldVersion>>()
  };
  kj::ArrayPtr<List<test::TestOldVersion>::Reader> array = lists;

  auto orphan3 = orphanage.newOrphan<test::TestAnyPointer>();
  orphan3.get().getAnyPointerField().adopt(message.getOrphanage().newOrphanConcat(array));

  auto cat = orphan3.getReader().getAnyPointerField().getAs<List<test::TestNewVersion>>();
  ASSERT_EQ(4, cat.size());

  EXPECT_EQ(12, cat[0].getOld1());
  EXPECT_EQ("foo", cat[0].getOld2());
  EXPECT_EQ(987, cat[0].getNew1());
  EXPECT_FALSE(cat[0].hasNew2());

  EXPECT_EQ(34, cat[1].getOld1());
  EXPECT_EQ("bar", cat[1].getOld2());
  EXPECT_EQ(987, cat[1].getNew1());
  EXPECT_FALSE(cat[1].hasNew2());

  EXPECT_EQ(56, cat[2].getOld1());
  EXPECT_EQ("baz", cat[2].getOld2());
  EXPECT_EQ(123, cat[2].getNew1());
  EXPECT_EQ("corge", cat[2].getNew2());

  EXPECT_EQ(78, cat[3].getOld1());
  EXPECT_EQ("qux", cat[3].getOld2());
  EXPECT_EQ(456, cat[3].getNew1());
  EXPECT_EQ("grault", cat[3].getNew2());
}